

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_15::BinaryReaderIR::SetBlockDeclaration
          (BinaryReaderIR *this,BlockDeclaration *decl,Type sig_type)

{
  pointer pTVar1;
  Index index;
  Type local_98;
  Location local_90;
  Var local_70;
  
  local_98 = sig_type;
  if (sig_type.enum_ < Any) {
    decl->has_func_type = false;
    pTVar1 = (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_finish != pTVar1) {
      (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = pTVar1;
    }
    Type::GetInlineVector((TypeVector *)&local_90,&local_98);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::_M_move_assign
              (&(decl->sig).result_types,&local_90);
    std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
              ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&local_90);
  }
  else {
    index = Type::GetIndex(&local_98);
    GetLocation(&local_90,this);
    Var::Var(&local_70,index,&local_90);
    SetFuncDeclaration(this,decl,&local_70);
    Var::~Var(&local_70);
  }
  return;
}

Assistant:

void BinaryReaderIR::SetBlockDeclaration(BlockDeclaration* decl,
                                         Type sig_type) {
  if (sig_type.IsIndex()) {
    Index type_index = sig_type.GetIndex();
    SetFuncDeclaration(decl, Var(type_index, GetLocation()));
  } else {
    decl->has_func_type = false;
    decl->sig.param_types.clear();
    decl->sig.result_types = sig_type.GetInlineVector();
  }
}